

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::setEnvironmentName(Triple *this,StringRef Str)

{
  StringRef local_178;
  StringRef local_168;
  StringRef local_158;
  StringRef local_148;
  Twine local_138;
  Twine local_120;
  Twine local_108;
  Twine local_f0;
  Twine local_d8;
  Twine local_c0;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  
  local_148.Length = Str.Length;
  local_148.Data = Str.Data;
  local_158 = getArchName(this);
  Twine::Twine(&local_c0,&local_158,"-");
  local_168 = getVendorName(this);
  Twine::Twine(&local_d8,&local_168);
  Twine::concat(&local_a8,&local_c0,&local_d8);
  Twine::Twine(&local_f0,"-");
  Twine::concat(&local_90,&local_a8,&local_f0);
  local_178 = getOSName(this);
  Twine::Twine(&local_108,&local_178);
  Twine::concat(&local_78,&local_90,&local_108);
  Twine::Twine(&local_120,"-");
  Twine::concat(&local_60,&local_78,&local_120);
  Twine::Twine(&local_138,&local_148);
  Twine::concat(&local_48,&local_60,&local_138);
  setTriple(this,&local_48);
  return;
}

Assistant:

void Triple::setEnvironmentName(StringRef Str) {
  setTriple(getArchName() + "-" + getVendorName() + "-" + getOSName() +
            "-" + Str);
}